

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

mz_bool tinyexr::miniz::mz_zip_reader_read_central_dir(mz_zip_archive *pZip,mz_uint32 flags)

{
  uint uVar1;
  int *piVar2;
  size_t sVar3;
  ulong uVar4;
  size_t sVar5;
  void *pvVar6;
  mz_zip_internal_state *pmVar7;
  mz_zip_internal_state *pmVar8;
  mz_zip_archive *pmVar9;
  int *piVar10;
  uint uVar11;
  mz_zip_archive *pZip_00;
  size_t new_capacity_1;
  ulong uVar12;
  ulong uVar13;
  size_t new_capacity;
  mz_uint64 mVar14;
  bool bVar15;
  mz_uint32 buf_u32 [1024];
  int local_1038;
  short local_1034;
  short local_1032;
  ushort local_1030;
  ushort local_102e;
  uint local_102c;
  uint local_1028;
  
  uVar12 = pZip->m_archive_size;
  if (0x15 < uVar12) {
    mVar14 = uVar12 - 0x1000;
    if ((long)uVar12 < 0x1001) {
      mVar14 = 0;
    }
    do {
      uVar12 = uVar12 - mVar14;
      sVar5 = 0x1000;
      if (uVar12 < 0x1000) {
        sVar5 = uVar12;
      }
      sVar3 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar14,&local_1038,sVar5);
      if (sVar3 != sVar5) {
        return 0;
      }
      if (3 < uVar12) {
        uVar11 = (int)sVar5 - 4;
        do {
          if (*(int *)((long)&local_1038 + (ulong)uVar11) == 0x6054b50) {
            sVar5 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar14 + uVar11,&local_1038,0x16);
            if (sVar5 != 0x16) {
              return 0;
            }
            if (local_1038 != 0x6054b50) {
              return 0;
            }
            uVar11 = (uint)local_102e;
            pZip->m_total_files = (uint)local_102e;
            if ((uint)local_102e != (uint)local_1030) {
              return 0;
            }
            if (local_1032 != 0 || local_1034 != 0) {
              if (local_1034 != 1) {
                return 0;
              }
              if (local_1032 != 1) {
                return 0;
              }
            }
            if (local_102c < (uint)local_102e * 0x2e) {
              return 0;
            }
            uVar12 = (ulong)local_1028;
            uVar4 = (ulong)local_102c;
            if (pZip->m_archive_size < uVar12 + uVar4) {
              return 0;
            }
            pZip->m_central_directory_file_ofs = uVar12;
            if (local_102e != 0) {
              pmVar8 = pZip->m_pState;
              pmVar7 = pmVar8;
              if ((pmVar8->m_central_dir).m_capacity < uVar4) {
                pvVar6 = (*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,(pmVar8->m_central_dir).m_p,
                                             (size_t)(pmVar8->m_central_dir).m_element_size,uVar4);
                if (pvVar6 == (void *)0x0) {
                  return 0;
                }
                (pmVar8->m_central_dir).m_p = pvVar6;
                (pmVar8->m_central_dir).m_capacity = uVar4;
                pmVar7 = pZip->m_pState;
                uVar11 = pZip->m_total_files;
              }
              (pmVar8->m_central_dir).m_size = uVar4;
              uVar13 = (ulong)uVar11;
              pmVar8 = pmVar7;
              if ((pmVar7->m_central_dir_offsets).m_capacity < uVar13) {
                pvVar6 = (*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,
                                             (pmVar7->m_central_dir_offsets).m_p,
                                             (size_t)(pmVar7->m_central_dir_offsets).m_element_size,
                                             uVar13);
                if (pvVar6 == (void *)0x0) {
                  return 0;
                }
                (pmVar7->m_central_dir_offsets).m_p = pvVar6;
                (pmVar7->m_central_dir_offsets).m_capacity = uVar13;
                pmVar8 = pZip->m_pState;
              }
              (pmVar7->m_central_dir_offsets).m_size = uVar13;
              if ((flags >> 0xb & 1) == 0) {
                uVar13 = (ulong)pZip->m_total_files;
                pmVar7 = pmVar8;
                if ((pmVar8->m_sorted_central_dir_offsets).m_capacity < uVar13) {
                  pvVar6 = (*pZip->m_pRealloc)(pZip->m_pAlloc_opaque,
                                               (pmVar8->m_sorted_central_dir_offsets).m_p,
                                               (size_t)(pmVar8->m_sorted_central_dir_offsets).
                                                       m_element_size,uVar13);
                  if (pvVar6 == (void *)0x0) {
                    return 0;
                  }
                  (pmVar8->m_sorted_central_dir_offsets).m_p = pvVar6;
                  (pmVar8->m_sorted_central_dir_offsets).m_capacity = uVar13;
                  pmVar7 = pZip->m_pState;
                }
                (pmVar8->m_sorted_central_dir_offsets).m_size = uVar13;
                pmVar8 = pmVar7;
              }
              sVar5 = (*pZip->m_pRead)(pZip->m_pIO_opaque,uVar12,(pmVar8->m_central_dir).m_p,uVar4);
              if (sVar5 != uVar4) {
                return 0;
              }
              if (pZip->m_total_files != 0) {
                pmVar8 = pZip->m_pState;
                piVar2 = (int *)(pmVar8->m_central_dir).m_p;
                pmVar9 = (mz_zip_archive *)0x0;
                piVar10 = piVar2;
                do {
                  if (local_102c < 0x2e) {
                    return 0;
                  }
                  if (*piVar10 != 0x2014b50) {
                    return 0;
                  }
                  *(int *)((long)(pmVar8->m_central_dir_offsets).m_p + (long)pmVar9 * 4) =
                       (int)piVar10 - (int)piVar2;
                  if ((flags >> 0xb & 1) == 0) {
                    *(int *)((long)(pmVar8->m_sorted_central_dir_offsets).m_p + (long)pmVar9 * 4) =
                         (int)pmVar9;
                  }
                  uVar11 = piVar10[5];
                  uVar1 = piVar10[6];
                  if ((*(int *)((long)piVar10 + 10) == 0) && (uVar1 != uVar11)) {
                    return 0;
                  }
                  if (uVar1 == 0xffffffff) {
                    return 0;
                  }
                  if (uVar1 != 0 && uVar11 == 0) {
                    return 0;
                  }
                  if (uVar11 == 0xffffffff) {
                    return 0;
                  }
                  if (*(short *)((long)piVar10 + 0x22) != local_1034 &&
                      *(short *)((long)piVar10 + 0x22) != 1) {
                    return 0;
                  }
                  if (pZip->m_archive_size <
                      (ulong)uVar11 + (ulong)*(uint *)((long)piVar10 + 0x2a) + 0x1e) {
                    return 0;
                  }
                  uVar11 = (uint)*(ushort *)(piVar10 + 8) +
                           (uint)*(ushort *)((long)piVar10 + 0x1e) + (uint)*(ushort *)(piVar10 + 7)
                           + 0x2e;
                  bVar15 = local_102c < uVar11;
                  local_102c = local_102c - uVar11;
                  if (bVar15) {
                    return 0;
                  }
                  piVar10 = (int *)((long)piVar10 + (ulong)uVar11);
                  pmVar9 = (mz_zip_archive *)((long)&pmVar9->m_archive_size + 1);
                  pZip_00 = (mz_zip_archive *)(ulong)pZip->m_total_files;
                } while (pmVar9 < pZip_00);
LAB_00121c4a:
                if ((flags >> 0xb & 1) == 0) {
                  mz_zip_reader_sort_central_dir_offsets_by_filename(pZip_00);
                }
                return 1;
              }
            }
            pZip_00 = (mz_zip_archive *)0x0;
            goto LAB_00121c4a;
          }
          bVar15 = 0 < (int)uVar11;
          uVar11 = uVar11 - 1;
        } while (bVar15);
      }
      if (mVar14 == 0) {
        return 0;
      }
      uVar12 = pZip->m_archive_size;
      uVar4 = uVar12 - mVar14;
      mVar14 = mVar14 - 0xffd;
    } while (uVar4 < 0x10015);
  }
  return 0;
}

Assistant:

static mz_bool mz_zip_reader_read_central_dir(mz_zip_archive *pZip,
                                              mz_uint32 flags) {
  mz_uint cdir_size, num_this_disk, cdir_disk_index;
  mz_uint64 cdir_ofs;
  mz_int64 cur_file_ofs;
  const mz_uint8 *p;
  mz_uint32 buf_u32[4096 / sizeof(mz_uint32)];
  mz_uint8 *pBuf = (mz_uint8 *)buf_u32;
  mz_bool sort_central_dir =
      ((flags & MZ_ZIP_FLAG_DO_NOT_SORT_CENTRAL_DIRECTORY) == 0);
  // Basic sanity checks - reject files which are too small, and check the first
  // 4 bytes of the file to make sure a local header is there.
  if (pZip->m_archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  // Find the end of central directory record by scanning the file from the end
  // towards the beginning.
  cur_file_ofs =
      MZ_MAX((mz_int64)pZip->m_archive_size - (mz_int64)sizeof(buf_u32), 0);
  for (;;) {
    int i,
        n = (int)MZ_MIN(sizeof(buf_u32), pZip->m_archive_size - cur_file_ofs);
    if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf, n) != (mz_uint)n)
      return MZ_FALSE;
    for (i = n - 4; i >= 0; --i)
      if (MZ_READ_LE32(pBuf + i) == MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG) break;
    if (i >= 0) {
      cur_file_ofs += i;
      break;
    }
    if ((!cur_file_ofs) || ((pZip->m_archive_size - cur_file_ofs) >=
                            (0xFFFF + MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)))
      return MZ_FALSE;
    cur_file_ofs = MZ_MAX(cur_file_ofs - (sizeof(buf_u32) - 3), 0);
  }
  // Read and verify the end of central directory record.
  if (pZip->m_pRead(pZip->m_pIO_opaque, cur_file_ofs, pBuf,
                    MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE) !=
      MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
    return MZ_FALSE;
  if ((MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_SIG_OFS) !=
       MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIG) ||
      ((pZip->m_total_files =
            MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_TOTAL_ENTRIES_OFS)) !=
       MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_CDIR_NUM_ENTRIES_ON_DISK_OFS)))
    return MZ_FALSE;

  num_this_disk = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_THIS_DISK_OFS);
  cdir_disk_index = MZ_READ_LE16(pBuf + MZ_ZIP_ECDH_NUM_DISK_CDIR_OFS);
  if (((num_this_disk | cdir_disk_index) != 0) &&
      ((num_this_disk != 1) || (cdir_disk_index != 1)))
    return MZ_FALSE;

  if ((cdir_size = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_SIZE_OFS)) <
      pZip->m_total_files * MZ_ZIP_CENTRAL_DIR_HEADER_SIZE)
    return MZ_FALSE;

  cdir_ofs = MZ_READ_LE32(pBuf + MZ_ZIP_ECDH_CDIR_OFS_OFS);
  if ((cdir_ofs + (mz_uint64)cdir_size) > pZip->m_archive_size) return MZ_FALSE;

  pZip->m_central_directory_file_ofs = cdir_ofs;

  if (pZip->m_total_files) {
    mz_uint i, n;

    // Read the entire central directory into a heap block, and allocate another
    // heap block to hold the unsorted central dir file record offsets, and
    // another to hold the sorted indices.
    if ((!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir, cdir_size,
                              MZ_FALSE)) ||
        (!mz_zip_array_resize(pZip, &pZip->m_pState->m_central_dir_offsets,
                              pZip->m_total_files, MZ_FALSE)))
      return MZ_FALSE;

    if (sort_central_dir) {
      if (!mz_zip_array_resize(pZip,
                               &pZip->m_pState->m_sorted_central_dir_offsets,
                               pZip->m_total_files, MZ_FALSE))
        return MZ_FALSE;
    }

    if (pZip->m_pRead(pZip->m_pIO_opaque, cdir_ofs,
                      pZip->m_pState->m_central_dir.m_p,
                      cdir_size) != cdir_size)
      return MZ_FALSE;

    // Now create an index into the central directory file records, do some
    // basic sanity checking on each record, and check for zip64 entries (which
    // are not yet supported).
    p = (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p;
    for (n = cdir_size, i = 0; i < pZip->m_total_files; ++i) {
      mz_uint total_header_size, comp_size, decomp_size, disk_index;
      if ((n < MZ_ZIP_CENTRAL_DIR_HEADER_SIZE) ||
          (MZ_READ_LE32(p) != MZ_ZIP_CENTRAL_DIR_HEADER_SIG))
        return MZ_FALSE;
      MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_central_dir_offsets, mz_uint32,
                           i) =
          (mz_uint32)(p - (const mz_uint8 *)pZip->m_pState->m_central_dir.m_p);
      if (sort_central_dir)
        MZ_ZIP_ARRAY_ELEMENT(&pZip->m_pState->m_sorted_central_dir_offsets,
                             mz_uint32, i) = i;
      comp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_COMPRESSED_SIZE_OFS);
      decomp_size = MZ_READ_LE32(p + MZ_ZIP_CDH_DECOMPRESSED_SIZE_OFS);
      if (((!MZ_READ_LE32(p + MZ_ZIP_CDH_METHOD_OFS)) &&
           (decomp_size != comp_size)) ||
          (decomp_size && !comp_size) || (decomp_size == 0xFFFFFFFF) ||
          (comp_size == 0xFFFFFFFF))
        return MZ_FALSE;
      disk_index = MZ_READ_LE16(p + MZ_ZIP_CDH_DISK_START_OFS);
      if ((disk_index != num_this_disk) && (disk_index != 1)) return MZ_FALSE;
      if (((mz_uint64)MZ_READ_LE32(p + MZ_ZIP_CDH_LOCAL_HEADER_OFS) +
           MZ_ZIP_LOCAL_DIR_HEADER_SIZE + comp_size) > pZip->m_archive_size)
        return MZ_FALSE;
      if ((total_header_size = MZ_ZIP_CENTRAL_DIR_HEADER_SIZE +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_FILENAME_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_EXTRA_LEN_OFS) +
                               MZ_READ_LE16(p + MZ_ZIP_CDH_COMMENT_LEN_OFS)) >
          n)
        return MZ_FALSE;
      n -= total_header_size;
      p += total_header_size;
    }
  }

  if (sort_central_dir)
    mz_zip_reader_sort_central_dir_offsets_by_filename(pZip);

  return MZ_TRUE;
}